

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  Argument *pAVar1;
  ostream *poVar2;
  string_view arg_name;
  string_view arg_name_00;
  allocator<char> local_5e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528;
  string local_508;
  ArgumentParser program;
  server_t s;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"file",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"devel",(allocator<char> *)&addr);
  argparse::ArgumentParser::ArgumentParser
            (&program,&local_508,&local_528,all,true,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  pAVar1 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-dir");
  pAVar1 = argparse::Argument::default_value(pAVar1,"./public");
  std::__cxx11::string::string<std::allocator<char>>
            (local_548,"public directory",(allocator<char> *)&s);
  std::__cxx11::string::operator=((string *)&pAVar1->m_help,local_548);
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,"PUBLIC_DIR",(allocator<char> *)&addr);
  std::__cxx11::string::operator=((string *)&pAVar1->m_metavar,local_568);
  argparse::Argument::nargs(pAVar1,1);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_548);
  pAVar1 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-addr");
  pAVar1 = argparse::Argument::default_value(pAVar1,"0.0.0.0:8080");
  std::__cxx11::string::string<std::allocator<char>>
            (local_588,"server address",(allocator<char> *)&s);
  std::__cxx11::string::operator=((string *)&pAVar1->m_help,local_588);
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"ADDR",(allocator<char> *)&addr);
  std::__cxx11::string::operator=((string *)&pAVar1->m_metavar,local_5a8);
  argparse::Argument::nargs(pAVar1,1);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::string::~string(local_588);
  argparse::ArgumentParser::parse_args(&program,argc,argv);
  clask::server_t::server_t(&s);
  clask::logger::default_level = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&addr,"/",&local_5e9);
  arg_name._M_str = "-dir";
  arg_name._M_len = 4;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_5c8,&program,arg_name);
  clask::server_t::static_dir(&s,&addr,&local_5c8,false);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&addr);
  arg_name_00._M_str = "-addr";
  arg_name_00._M_len = 5;
  argparse::ArgumentParser::get<std::__cxx11::string>(&addr,&program,arg_name_00);
  poVar2 = std::operator<<((ostream *)&std::cerr,"started ");
  poVar2 = std::operator<<(poVar2,(string *)&addr);
  std::endl<char,std::char_traits<char>>(poVar2);
  clask::server_t::run(&s,&addr);
  std::__cxx11::string::~string((string *)&addr);
  clask::server_t::~server_t(&s);
  argparse::ArgumentParser::~ArgumentParser(&program);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  argparse::ArgumentParser program("file", CLASK_VERSION);
  program.add_argument("-dir")
      .default_value("./public")
      .help("public directory")
      .metavar("PUBLIC_DIR")
      .nargs(1);
  program.add_argument("-addr")
      .default_value("0.0.0.0:8080")
      .help("server address")
      .metavar("ADDR")
      .nargs(1);
  program.parse_args(argc, argv);

  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/", program.get<std::string>("-dir"));

  auto addr = program.get<std::string>("-addr");
  std::cerr << "started " << addr << std::endl;
  s.run(addr);
}